

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

int __thiscall Fossilize::Device::init(Device *this,EVP_PKEY_CTX *ctx)

{
  Instance *this_00;
  VkLayerInstanceDispatchTable *pVVar1;
  VkApplicationInfo *appInfo;
  StateRecorder *pSVar2;
  Instance *in_RCX;
  VkDevice in_RDX;
  void *in_R8;
  VkLayerDispatchTable *in_R9;
  undefined8 local_3a8;
  VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT identifierProps;
  VkPhysicalDeviceProperties2 props2;
  VkPhysicalDeviceShaderModuleIdentifierFeaturesEXT *identifier;
  VkLayerDispatchTable *pTable__local;
  void *device_pnext_local;
  Instance *pInstance__local;
  VkDevice device__local;
  VkPhysicalDevice gpu__local;
  Device *this_local;
  
  this->gpu = (VkPhysicalDevice)ctx;
  this->device = in_RDX;
  this->pInstance = in_RCX;
  pVVar1 = Instance::getTable(this->pInstance);
  this->pInstanceTable = pVVar1;
  this->pTable = in_R9;
  props2.properties._816_8_ =
       findpNext(in_R8,VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT);
  memset(identifierProps.shaderModuleIdentifierAlgorithmUUID + 8,0,0x348);
  identifierProps.shaderModuleIdentifierAlgorithmUUID[8] = 'y';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[9] = 0xb0;
  identifierProps.shaderModuleIdentifierAlgorithmUUID[10] = 0x9b;
  identifierProps.shaderModuleIdentifierAlgorithmUUID[0xb] = ';';
  local_3a8 = 0x3ba1d6b1;
  identifierProps.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  identifierProps._4_4_ = 0;
  identifierProps.pNext = (void *)0x0;
  identifierProps.shaderModuleIdentifierAlgorithmUUID[0] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[1] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[2] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[3] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[4] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[5] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[6] = '\0';
  identifierProps.shaderModuleIdentifierAlgorithmUUID[7] = '\0';
  if ((props2.properties._816_8_ == 0) || (*(int *)(props2.properties._816_8_ + 0x10) == 0)) {
    (*this->pInstanceTable->GetPhysicalDeviceProperties)
              (this->gpu,(VkPhysicalDeviceProperties *)&props2.pNext);
  }
  else {
    props2._0_8_ = &local_3a8;
    if (this->pInstanceTable->GetPhysicalDeviceProperties2 ==
        (PFN_vkGetPhysicalDeviceProperties2)0x0) {
      if (this->pInstanceTable->GetPhysicalDeviceProperties2KHR ==
          (PFN_vkGetPhysicalDeviceProperties2KHR)0x0) {
        (*this->pInstanceTable->GetPhysicalDeviceProperties)
                  (this->gpu,(VkPhysicalDeviceProperties *)&props2.pNext);
      }
      else {
        (*this->pInstanceTable->GetPhysicalDeviceProperties2KHR)
                  (this->gpu,
                   (VkPhysicalDeviceProperties2 *)
                   (identifierProps.shaderModuleIdentifierAlgorithmUUID + 8));
      }
    }
    else {
      (*this->pInstanceTable->GetPhysicalDeviceProperties2)
                (this->gpu,
                 (VkPhysicalDeviceProperties2 *)
                 (identifierProps.shaderModuleIdentifierAlgorithmUUID + 8));
    }
    this->usesModuleIdentifiers = true;
  }
  this_00 = this->pInstance;
  appInfo = Instance::getApplicationInfo(this->pInstance);
  pSVar2 = Instance::getStateRecorderForDevice
                     (this_00,(VkPhysicalDeviceProperties2 *)
                              (identifierProps.shaderModuleIdentifierAlgorithmUUID + 8),appInfo,
                      in_R8);
  this->recorder = pSVar2;
  return (int)this;
}

Assistant:

void Device::init(VkPhysicalDevice gpu_, VkDevice device_, Instance *pInstance_,
                  const void *device_pnext,
                  VkLayerDispatchTable *pTable_)
{
	gpu = gpu_;
	device = device_;
	pInstance = pInstance_;
	pInstanceTable = pInstance->getTable();
	pTable = pTable_;

	// Need to know the UUID hash, so we can write module identifiers to appropriate path.
	auto *identifier =
			static_cast<const VkPhysicalDeviceShaderModuleIdentifierFeaturesEXT *>(
					findpNext(device_pnext,
					          VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT));

	VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT identifierProps =
			{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_PROPERTIES_EXT };

	// Only bother if the application is actually using shader module identifiers.
	if (identifier && identifier->shaderModuleIdentifier)
	{
		props2.pNext = &identifierProps;
		if (pInstanceTable->GetPhysicalDeviceProperties2)
			pInstanceTable->GetPhysicalDeviceProperties2(gpu, &props2);
		else if (pInstanceTable->GetPhysicalDeviceProperties2KHR)
			pInstanceTable->GetPhysicalDeviceProperties2KHR(gpu, &props2);
		else
			pInstanceTable->GetPhysicalDeviceProperties(gpu, &props2.properties);

		usesModuleIdentifiers = true;
	}
	else
	{
		pInstanceTable->GetPhysicalDeviceProperties(gpu, &props2.properties);
	}

	recorder = pInstance->getStateRecorderForDevice(&props2, pInstance->getApplicationInfo(), device_pnext);
}